

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall CConsole::RegisterTempMap(CConsole *this,char *pName)

{
  long *plVar1;
  char *in_RDI;
  CMapListEntryTemp *pEntry;
  char *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd8;
  uint Size;
  CHeap *in_stack_ffffffffffffffe0;
  
  Size = (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if (*(long *)(in_RDI + 0xe0) == 0) {
    in_stack_ffffffffffffffc8 = (char *)operator_new(8);
    CHeap::CHeap((CHeap *)0x1452cf);
    *(char **)(in_RDI + 0xe0) = in_stack_ffffffffffffffc8;
  }
  plVar1 = (long *)CHeap::Allocate(in_stack_ffffffffffffffe0,Size);
  plVar1[1] = 0;
  *plVar1 = *(long *)(in_RDI + 0xf0);
  if (*plVar1 != 0) {
    *(long **)(*plVar1 + 8) = plVar1;
  }
  *(long **)(in_RDI + 0xf0) = plVar1;
  if (*(long *)(in_RDI + 0xe8) == 0) {
    *(long **)(in_RDI + 0xe8) = plVar1;
  }
  str_copy(in_RDI,in_stack_ffffffffffffffc8,0);
  return;
}

Assistant:

void CConsole::RegisterTempMap(const char *pName)
{
	if(!m_pTempMapListHeap)
		m_pTempMapListHeap = new CHeap();
	CMapListEntryTemp *pEntry = (CMapListEntryTemp *)m_pTempMapListHeap->Allocate(sizeof(CMapListEntryTemp));
	pEntry->m_pNext = 0;
	pEntry->m_pPrev = m_pLastMapEntry;
	if(pEntry->m_pPrev)
		pEntry->m_pPrev->m_pNext = pEntry;
	m_pLastMapEntry = pEntry;
	if(!m_pFirstMapEntry)
		m_pFirstMapEntry = pEntry;
	str_copy(pEntry->m_aName, pName, TEMPMAP_NAME_LENGTH);
}